

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.h
# Opt level: O2

string * __thiscall
anurbs::Entry<anurbs::NurbsCurveGeometry<3l>>::key_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)((long)this + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string key() const override
    {
        return m_key;
    }